

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::
vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>_>
::clear(vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>_>
        *this)

{
  _Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>
  *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if ((in_RDI->
      super__Node_iterator_base<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_true>
      )._M_cur != (__node_type *)0x0) {
    scalar_type<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>_>
    ::destruct_array(in_RDI,in_stack_ffffffffffffffe8);
    free((in_RDI->
         super__Node_iterator_base<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_true>
         )._M_cur);
    (in_RDI->
    super__Node_iterator_base<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_true>
    )._M_cur = (__node_type *)0x0;
    *(undefined4 *)
     &in_RDI[1].
      super__Node_iterator_base<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_true>
      ._M_cur = 0;
    *(undefined4 *)
     ((long)&in_RDI[1].
             super__Node_iterator_base<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_true>
             ._M_cur + 4) = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }